

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O3

bool __thiscall doublechecked::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = roaring::Roaring64Map::isSubset(&this->plain,&r->plain);
  bVar2 = std::
          __includes<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     &(r->check)._M_t._M_impl.super__Rb_tree_header,
                     (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     &(this->check)._M_t._M_impl.super__Rb_tree_header);
  _assert_true((ulong)(bVar2 == bVar1),
               "ans == std::includes( r.check.begin(), r.check.end(), check.begin(), check.end() )",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0x167);
  return bVar1;
}

Assistant:

bool isSubset(const Roaring64Map &r) const {  // is `this` subset of `r`?
        bool ans = plain.isSubset(r.plain);
        assert_true(ans == std::includes(
                               r.check.begin(),
                               r.check.end(),  // containing range
                               check.begin(),
                               check.end()  // range to test for containment
                               ));
        return ans;
    }